

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.c
# Opt level: O0

int block_and_read(int fd,void *buf,size_t len)

{
  _Bool _Var1;
  int iVar2;
  pollwrapper *pw_00;
  ssize_t sVar3;
  int *piVar4;
  bool bVar5;
  pollwrapper *pw;
  int ret;
  size_t len_local;
  void *buf_local;
  int fd_local;
  
  pw_00 = pollwrap_new();
  do {
    sVar3 = read(fd,buf,len);
    bVar5 = false;
    if ((int)sVar3 < 0) {
      piVar4 = __errno_location();
      bVar5 = true;
      if (*piVar4 != 0xb) {
        piVar4 = __errno_location();
        bVar5 = true;
        if (*piVar4 != 0xb) {
          bVar5 = false;
        }
      }
    }
    if (!bVar5) {
      pollwrap_free(pw_00);
      return (int)sVar3;
    }
    pollwrap_clear(pw_00);
    pollwrap_add_fd_rwx(pw_00,fd,1);
    do {
      iVar2 = pollwrap_poll_endless(pw_00);
      bVar5 = false;
      if (iVar2 < 0) {
        piVar4 = __errno_location();
        bVar5 = *piVar4 == 4;
      }
    } while (bVar5);
    if (iVar2 == 0) {
      __assert_fail("ret != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/console.c"
                    ,0x5d,"int block_and_read(int, void *, size_t)");
    }
    if (iVar2 < 0) {
      pollwrap_free(pw_00);
      return iVar2;
    }
    _Var1 = pollwrap_check_fd_rwx(pw_00,fd,1);
  } while (_Var1);
  __assert_fail("pollwrap_check_fd_rwx(pw, fd, SELECT_R)",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/console.c",
                0x62,"int block_and_read(int, void *, size_t)");
}

Assistant:

static int block_and_read(int fd, void *buf, size_t len)
{
    int ret;
    pollwrapper *pw = pollwrap_new();

    while ((ret = read(fd, buf, len)) < 0 && (
#ifdef EAGAIN
               (errno == EAGAIN) ||
#endif
#ifdef EWOULDBLOCK
               (errno == EWOULDBLOCK) ||
#endif
               false)) {

        pollwrap_clear(pw);
        pollwrap_add_fd_rwx(pw, fd, SELECT_R);
        do {
            ret = pollwrap_poll_endless(pw);
        } while (ret < 0 && errno == EINTR);
        assert(ret != 0);
        if (ret < 0) {
            pollwrap_free(pw);
            return ret;
        }
        assert(pollwrap_check_fd_rwx(pw, fd, SELECT_R));
    }

    pollwrap_free(pw);
    return ret;
}